

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::MembranePolicyImpl::~MembranePolicyImpl(MembranePolicyImpl *this)

{
  MembranePolicyImpl *this_local;
  
  (this->super_MembranePolicy)._vptr_MembranePolicy = (_func_int **)&PTR_inboundCall_00cbdb30;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_00cbdb98;
  kj::Maybe<kj::ForkedPromise<void>_>::~Maybe(&this->revokePromise);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

MembranePolicyImpl() = default;